

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatawidgetmapper.cpp
# Opt level: O3

void QDataWidgetMapper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  long lVar2;
  QDataWidgetMapperPrivate *this;
  pointer pWVar3;
  bool bVar4;
  int iVar5;
  SubmitPolicy *pSVar6;
  code *UNRECOVERED_JUMPTABLE;
  SubmitPolicy SVar7;
  WidgetMapper *e;
  pointer m;
  long in_FS_OFFSET;
  undefined4 local_3c;
  void *local_38;
  undefined4 *local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_3c = *_a[1];
      local_30 = &local_3c;
      local_38 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_38);
      goto switchD_00567425_caseD_3;
    case 1:
      this = *(QDataWidgetMapperPrivate **)(_o + 8);
      pWVar3 = (this->widgetMap).
               super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (m = (this->widgetMap).
               super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
               ._M_impl.super__Vector_impl_data._M_start; m != pWVar3; m = m + 1) {
        QDataWidgetMapperPrivate::populate(this,m);
      }
      goto switchD_00567425_caseD_3;
    case 2:
      bVar4 = submit((QDataWidgetMapper *)_o);
      if (*_a != (void *)0x0) {
        *(bool *)*_a = bVar4;
      }
      goto switchD_00567425_caseD_3;
    case 3:
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x60);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) break;
      SVar7 = AutoSubmit;
      goto LAB_005675ba;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        toLast((QDataWidgetMapper *)_o);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        toNext((QDataWidgetMapper *)_o);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        toPrevious((QDataWidgetMapper *)_o);
        return;
      }
      break;
    case 7:
      pSVar6 = (SubmitPolicy *)_a[1];
LAB_0056759d:
      SVar7 = *pSVar6;
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x60);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
LAB_005675ba:
        (*UNRECOVERED_JUMPTABLE)(_o,SVar7);
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setCurrentModelIndex((QDataWidgetMapper *)_o,(QModelIndex *)_a[1]);
        return;
      }
      break;
    default:
      goto switchD_00567425_caseD_3;
    }
    goto LAB_0056764f;
  case ReadProperty:
    piVar1 = (int *)*_a;
    if (_id == 2) {
      iVar5 = *(int *)(*(long *)(_o + 8) + 0x8c);
    }
    else if (_id == 1) {
      iVar5 = *(int *)(*(long *)(_o + 8) + 0x88);
    }
    else {
      if (_id != 0) break;
      iVar5 = currentIndex((QDataWidgetMapper *)_o);
    }
    *piVar1 = iVar5;
    break;
  case WriteProperty:
    pSVar6 = (SubmitPolicy *)*_a;
    if (_id == 2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        setSubmitPolicy((QDataWidgetMapper *)_o,*pSVar6);
        return;
      }
      goto LAB_0056764f;
    }
    if (_id == 1) {
      SVar7 = *pSVar6;
      lVar2 = *(long *)(_o + 8);
      if (*(SubmitPolicy *)(lVar2 + 0x88) != SVar7) {
        clearMapping((QDataWidgetMapper *)_o);
        *(SubmitPolicy *)(lVar2 + 0x88) = SVar7;
      }
    }
    else if (_id == 0) goto LAB_0056759d;
    break;
  case IndexOfMethod:
    if ((*_a[1] == currentIndexChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
switchD_00567425_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0056764f:
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDataWidgetMapper *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->revert(); break;
        case 2: { bool _r = _t->submit();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 3: _t->toFirst(); break;
        case 4: _t->toLast(); break;
        case 5: _t->toNext(); break;
        case 6: _t->toPrevious(); break;
        case 7: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->setCurrentModelIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDataWidgetMapper::*)(int )>(_a, &QDataWidgetMapper::currentIndexChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 1: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 2: *reinterpret_cast<SubmitPolicy*>(_v) = _t->submitPolicy(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 2: _t->setSubmitPolicy(*reinterpret_cast<SubmitPolicy*>(_v)); break;
        default: break;
        }
    }
}